

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                 (char *target,ArrayPtr<const_char> *first,FixedArray<char,_1UL> *rest,
                 ArrayPtr<const_char> *rest_1,FixedArray<char,_1UL> *rest_2,
                 ArrayPtr<const_char> *rest_3,FixedArray<char,_1UL> *rest_4,
                 ArrayPtr<const_char> *rest_5)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(target,first->ptr,sVar1);
    target = target + sVar1;
  }
  *target = rest->content[0];
  pcVar2 = target + 1;
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pcVar2,rest_1->ptr,sVar1);
    pcVar2 = pcVar2 + sVar1;
  }
  *pcVar2 = rest_2->content[0];
  pcVar2 = pcVar2 + 1;
  sVar1 = rest_3->size_;
  if (sVar1 != 0) {
    memcpy(pcVar2,rest_3->ptr,sVar1);
    pcVar2 = pcVar2 + sVar1;
  }
  *pcVar2 = rest_4->content[0];
  pcVar2 = pcVar2 + 1;
  sVar1 = rest_5->size_;
  if (sVar1 != 0) {
    memcpy(pcVar2,rest_5->ptr,sVar1);
    pcVar2 = pcVar2 + sVar1;
  }
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}